

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O1

Am_Wrapper * get_button_widget_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object widget;
  Am_Value value;
  undefined1 auStack_28 [16];
  undefined8 local_18;
  
  pAVar2 = (Am_Wrapper *)auStack_28;
  Am_Object::Get_Object((Am_Object *)auStack_28,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid((Am_Object *)auStack_28);
  if (bVar1) {
    auStack_28._8_2_ = 0;
    local_18 = 0;
    in_value = Am_Object::Get((Am_Object *)auStack_28,0x169,1);
    Am_Value::operator=((Am_Value *)(auStack_28 + 8),in_value);
    bVar1 = Am_Value::Valid((Am_Value *)(auStack_28 + 8));
    if (bVar1) {
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)auStack_28);
    }
    Am_Value::~Am_Value((Am_Value *)(auStack_28 + 8));
    if (bVar1) goto LAB_00262a0b;
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
LAB_00262a0b:
  Am_Object::~Am_Object((Am_Object *)auStack_28);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(get_button_widget_value)
{
  Am_Object widget = self.Get_Owner(); // widget the interactor is in
  if (widget.Valid()) {
    Am_Value value;
    value = widget.Peek(Am_VALUE);
    if (value.Valid())
      return widget;
  }
  return Am_No_Object;
}